

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setting.h
# Opt level: O0

void __thiscall YAML::SettingChanges::clear(SettingChanges *this)

{
  SettingChanges *unaff_retaddr;
  
  restore(unaff_retaddr);
  std::
  vector<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
  ::clear((vector<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>,_std::allocator<std::unique_ptr<YAML::SettingChangeBase,_std::default_delete<YAML::SettingChangeBase>_>_>_>
           *)0xefc7c2);
  return;
}

Assistant:

void clear() YAML_CPP_NOEXCEPT {
    restore();
    m_settingChanges.clear();
  }